

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* parse_util::split_param(string *p,string *sep,char open_par,char close_par)

{
  bool bVar1;
  value_type *pvVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  char in_CL;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char in_R8B;
  string t_1;
  string t;
  string symbols;
  size_type old_pos;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *temp;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  value_type *in_stack_fffffffffffffef8;
  value_type *pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [48];
  string local_50 [32];
  value_type *local_30;
  value_type *local_28;
  byte local_1b;
  char local_1a;
  char local_19;
  string *local_10;
  
  local_1b = 0;
  local_1a = in_R8B;
  local_19 = in_CL;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1fee1a);
  local_28 = (value_type *)0x0;
  local_30 = (value_type *)0x0;
  std::operator+(in_stack_ffffffffffffff08,(char)((ulong)in_stack_ffffffffffffff00 >> 0x38));
  while (pvVar5 = local_28, pvVar2 = (value_type *)std::__cxx11::string::size(), pvVar5 <= pvVar2) {
    local_28 = (value_type *)std::__cxx11::string::find_first_of(local_10,(ulong)local_50);
    if ((local_28 != (value_type *)0xffffffffffffffff) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_10), *pcVar3 == local_19)) {
      in_stack_ffffffffffffff00 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::__cxx11::string::find((char)local_10,(ulong)(uint)(int)local_1a);
      local_28 = (value_type *)in_stack_ffffffffffffff00;
      pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::__cxx11::string::size();
      if (in_stack_ffffffffffffff00 == pvVar4) {
        local_28 = (value_type *)0xffffffffffffffff;
      }
      else {
        local_28 = (value_type *)
                   ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_28->field_0x0)->_M_impl).super__Vector_impl_data._M_start + 1
                   );
      }
    }
    if (local_28 != (value_type *)0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_10);
      remove_spaces(in_stack_ffffffffffffff28);
      std::__cxx11::string::~string(local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_30 = local_28 + 1;
      local_28 = local_30;
      std::__cxx11::string::~string(local_80);
    }
  }
  if (local_28 != local_30) {
    pvVar5 = local_30;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_e0,(ulong)local_10);
    remove_spaces(in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_e0);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_10,(char *)CONCAT17(in_stack_fffffffffffffeef,
                                                      in_stack_fffffffffffffee8));
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_ffffffffffffff00,pvVar5);
    }
    std::__cxx11::string::~string(local_c0);
  }
  local_1b = 1;
  std::__cxx11::string::~string(local_50);
  if ((local_1b & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff00);
  }
  return in_RDI;
}

Assistant:

vector<string> split_param(const string &p, const string &sep,
                               char open_par, char close_par)
    {
        vector<string> temp;
        string::size_type pos = 0;
        string::size_type old_pos = 0;

        string symbols = sep + open_par;

        while (pos <= p.size()) {
            pos = p.find_first_of(symbols, pos);

            if (pos != string::npos)
                if (p[pos] == open_par) {
                    pos = p.find(close_par, pos);
                    if (pos == p.size()) pos = string::npos;
                    else ++pos;
                }

            if (pos != string::npos) {
                string t = remove_spaces(p.substr(old_pos, pos - old_pos));

                temp.push_back(t);

                old_pos = ++pos;
            }
        }

        if (pos != old_pos) {
            string t = remove_spaces(p.substr(old_pos, p.size() - old_pos));

            if (t != "") temp.push_back(t);
        }

        return temp;
    }